

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

NumericExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
::ReadNumericExpr_abi_cxx11_
          (NumericExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
          *this,char code,bool ignore_zero)

{
  int iVar1;
  undefined7 in_register_00000011;
  Expr local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  ArgList local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000011,code);
  switch(iVar1) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
    ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                    *)this,code);
    break;
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
switchD_001ba2c4_caseD_6d:
    local_38.field_1.values_ = (Value *)&local_48;
    local_48 = 0;
    uStack_40 = 0;
    local_38.types_ = 0;
    BinaryReaderBase::ReportError(*(BinaryReaderBase **)this,(CStringRef)0x2632c2,&local_38);
  case 0x6f:
    iVar1 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
            ::ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                          *)this);
    ReadNumericExpr_abi_cxx11_(__return_storage_ptr__,this,iVar1);
    return __return_storage_ptr__;
  case 0x76:
    DoReadReference_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  default:
    if (iVar1 != 0x66) goto switchD_001ba2c4_caseD_6d;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
    ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                *)this,*(uint *)(*(long *)(this + 8) + 0x60));
    iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                      (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
    if (0 < iVar1) {
      do {
        ReadSymbolicExpr_abi_cxx11_(&local_68,this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}